

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_f1f0ab::SegmentTree::produceIntersections
          (SegmentTree *this,TreeNode *node,int segment,RectF *segmentBounds,RectF *nodeBounds,
          int axis)

{
  QDataBuffer<QIntersection> *this_00;
  QPointF *pQVar1;
  qreal qVar2;
  qreal qVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  QPointF *pQVar7;
  Segment *pSVar8;
  QPathSegments *pQVar9;
  Segment *pSVar10;
  QIntersection *pQVar11;
  Intersection *pIVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  qreal qVar20;
  QPointF QVar21;
  Intersection *pIVar22;
  byte bVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  undefined7 uVar27;
  bool bVar28;
  long lVar29;
  bool bVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long in_FS_OFFSET;
  ulong uVar34;
  ulong uVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  qreal invDp;
  RectF local_78;
  undefined1 local_58 [16];
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (node->leaf == true) {
    iVar24 = (node->index).interval.first;
    lVar33 = (long)iVar24;
    if (iVar24 < (node->index).interval.last) {
      pQVar7 = (this->m_segments->m_points).buffer;
      pSVar8 = (this->m_segments->m_segments).buffer;
      pQVar1 = pQVar7 + pSVar8[segment].va;
      dVar4 = pQVar1->xp;
      dVar16 = pQVar1->yp;
      pQVar7 = pQVar7 + pSVar8[segment].vb;
      dVar17 = pQVar7->xp;
      dVar18 = pQVar7->yp;
      QVar21 = *pQVar7;
      this_00 = &this->m_intersections;
      dVar41 = dVar4 - dVar17;
      dVar47 = dVar16 - dVar18;
      uVar34 = -(ulong)(dVar41 < -dVar41);
      uVar35 = -(ulong)(dVar47 < -dVar47);
      dVar56 = dVar17 - dVar4;
      dVar52 = dVar18 - dVar16;
      dVar42 = 1.0 / (dVar56 * dVar56 + dVar52 * dVar52);
      auVar39._8_8_ = -(ulong)(1e-12 < (double)(~uVar35 & (ulong)dVar47 | (ulong)-dVar47 & uVar35));
      auVar39._0_8_ = -(ulong)(1e-12 < (double)(~uVar34 & (ulong)dVar41 | (ulong)-dVar41 & uVar34));
      iVar24 = movmskpd((int)this_00,auVar39);
      do {
        iVar5 = (this->m_index).d.ptr[lVar33];
        if (iVar5 < segment) {
          pQVar9 = this->m_segments;
          pSVar10 = (pQVar9->m_segments).buffer;
          dVar41 = pSVar8[segment].bounds.xp;
          dVar47 = pSVar10[iVar5].bounds.xp;
          if ((dVar41 <= pSVar10[iVar5].bounds.w + dVar47) &&
             (dVar47 <= dVar41 + pSVar8[segment].bounds.w)) {
            dVar41 = pSVar8[segment].bounds.yp;
            dVar47 = pSVar10[iVar5].bounds.yp;
            if ((dVar41 <= pSVar10[iVar5].bounds.h + dVar47) &&
               ((dVar47 <= dVar41 + pSVar8[segment].bounds.h &&
                ((this->m_intersections).siz = 0, iVar24 != 0)))) {
              pQVar7 = (pQVar9->m_points).buffer;
              pQVar1 = pQVar7 + pSVar10[iVar5].va;
              dVar41 = pQVar1->xp;
              dVar47 = pQVar1->yp;
              pQVar7 = pQVar7 + pSVar10[iVar5].vb;
              dVar57 = pQVar7->xp;
              dVar19 = pQVar7->yp;
              dVar36 = dVar41 - dVar57;
              uVar34 = -(ulong)(dVar36 < -dVar36);
              if ((1e-12 < (double)(~uVar34 & (ulong)dVar36 | (ulong)-dVar36 & uVar34)) ||
                 (dVar36 = dVar47 - dVar19, uVar34 = -(ulong)(dVar36 < -dVar36),
                 1e-12 < (double)(~uVar34 & (ulong)dVar36 | (ulong)-dVar36 & uVar34))) {
                dVar36 = dVar4 - dVar41;
                uVar34 = -(ulong)(dVar36 < -dVar36);
                if ((double)(~uVar34 & (ulong)dVar36 | (ulong)-dVar36 & uVar34) <= 1e-12) {
                  dVar37 = dVar16 - dVar47;
                  uVar34 = -(ulong)(dVar37 < -dVar37);
                  bVar13 = (double)(~uVar34 & (ulong)dVar37 | (ulong)-dVar37 & uVar34) <= 1e-12;
                  uVar27 = (undefined7)((ulong)((long)pSVar10[iVar5].vb * 0x10) >> 8);
                }
                else {
                  uVar27 = 0;
                  bVar13 = false;
                }
                dVar37 = dVar17 - dVar57;
                uVar34 = -(ulong)(dVar37 < -dVar37);
                if ((double)(~uVar34 & (ulong)dVar37 | (ulong)-dVar37 & uVar34) <= 1e-12) {
                  dVar37 = dVar18 - dVar19;
                  uVar34 = -(ulong)(dVar37 < -dVar37);
                  bVar14 = (double)(~uVar34 & (ulong)dVar37 | (ulong)-dVar37 & uVar34) <= 1e-12;
                  if ((bool)(bVar14 & bVar13)) goto LAB_003f09e2;
                }
                else {
                  bVar14 = false;
                }
                dVar37 = dVar4 - dVar57;
                uVar34 = -(ulong)(dVar37 < -dVar37);
                if ((double)(~uVar34 & (ulong)dVar37 | (ulong)-dVar37 & uVar34) <= 1e-12) {
                  dVar37 = dVar16 - dVar19;
                  uVar34 = -(ulong)(dVar37 < -dVar37);
                  bVar28 = (double)(~uVar34 & (ulong)dVar37 | (ulong)-dVar37 & uVar34) <= 1e-12;
                }
                else {
                  bVar28 = false;
                }
                dVar37 = dVar17 - dVar41;
                uVar34 = -(ulong)(dVar37 < -dVar37);
                if ((double)(~uVar34 & (ulong)dVar37 | (ulong)-dVar37 & uVar34) <= 1e-12) {
                  dVar58 = dVar18 - dVar47;
                  uVar34 = -(ulong)(dVar58 < -dVar58);
                  bVar30 = (double)(~uVar34 & (ulong)dVar58 | (ulong)-dVar58 & uVar34) <= 1e-12;
                  if ((bVar30 & bVar28) != 0) goto LAB_003f09e2;
                }
                else {
                  bVar30 = false;
                }
                dVar58 = dVar57 - dVar41;
                dVar59 = dVar19 - dVar47;
                auVar44._0_8_ = dVar56 * dVar59 + dVar58 * -dVar52;
                uVar34 = -(ulong)(auVar44._0_8_ < -auVar44._0_8_);
                if ((double)(~uVar34 & (ulong)auVar44._0_8_ | (ulong)-auVar44._0_8_ & uVar34) <=
                    1e-12) {
                  dVar43 = -dVar52 * (dVar41 - dVar4) + dVar56 * (dVar47 - dVar16);
                  uVar34 = -(ulong)(dVar43 < -dVar43);
                  if ((double)(~uVar34 & (ulong)dVar43 | (ulong)-dVar43 & uVar34) <= 1e-12) {
                    dVar43 = ((dVar41 - dVar4) * dVar56 + (dVar47 - dVar16) * dVar52) * dVar42;
                    if (dVar43 <= 0.0) {
                      lVar32 = 0;
                    }
                    else {
                      lVar32 = 0;
                      if (dVar43 < 1.0) {
                        QDataBuffer<QIntersection>::reserve(this_00,1);
                        lVar32 = (this->m_intersections).siz;
                        pQVar11 = (this->m_intersections).buffer;
                        pQVar11[lVar32].alphaA = dVar43;
                        pQVar11[lVar32].alphaB = 0.0;
                        pQVar11[lVar32].pos.xp = dVar41;
                        pQVar11[lVar32].pos.yp = dVar47;
                        lVar32 = lVar32 + 1;
                        (this->m_intersections).siz = lVar32;
                      }
                    }
                    dVar41 = ((dVar19 - dVar16) * dVar52 + dVar56 * (dVar57 - dVar4)) * dVar42;
                    if ((0.0 < dVar41) && (dVar41 < 1.0)) {
                      QDataBuffer<QIntersection>::reserve(this_00,lVar32 + 1);
                      lVar32 = (this->m_intersections).siz;
                      pQVar11 = (this->m_intersections).buffer;
                      pQVar11[lVar32].alphaA = dVar41;
                      pQVar11[lVar32].alphaB = 1.0;
                      pQVar11[lVar32].pos.xp = dVar57;
                      pQVar11[lVar32].pos.yp = dVar19;
                      lVar32 = lVar32 + 1;
                      (this->m_intersections).siz = lVar32;
                    }
                    dVar41 = 1.0 / (dVar58 * dVar58 + dVar59 * dVar59);
                    dVar57 = (dVar36 * dVar58 + (dVar16 - dVar47) * dVar59) * dVar41;
                    if ((0.0 < dVar57) && (dVar57 < 1.0)) {
                      QDataBuffer<QIntersection>::reserve(this_00,lVar32 + 1);
                      lVar32 = (this->m_intersections).siz;
                      pQVar11 = (this->m_intersections).buffer;
                      pQVar11[lVar32].alphaA = 0.0;
                      pQVar11[lVar32].alphaB = dVar57;
                      pQVar11[lVar32].pos.xp = dVar4;
                      pQVar11[lVar32].pos.yp = dVar16;
                      lVar32 = lVar32 + 1;
                      (this->m_intersections).siz = lVar32;
                    }
                    dVar41 = (dVar58 * dVar37 + (dVar18 - dVar47) * dVar59) * dVar41;
                    if ((0.0 < dVar41) && (dVar41 < 1.0)) {
                      QDataBuffer<QIntersection>::reserve(this_00,lVar32 + 1);
                      lVar32 = (this->m_intersections).siz;
                      pQVar11 = (this->m_intersections).buffer;
                      pQVar11[lVar32].alphaA = 1.0;
                      pQVar11[lVar32].alphaB = dVar41;
                      pQVar11[lVar32].pos = QVar21;
                      lVar32 = lVar32 + 1;
                      (this->m_intersections).siz = lVar32;
                    }
LAB_003f07d4:
                    if (0 < lVar32) {
                      lVar32 = 0;
                      do {
                        pQVar9 = this->m_segments;
                        pQVar11 = (this->m_intersections).buffer;
                        qVar2 = pQVar11[lVar32].alphaA;
                        qVar3 = pQVar11[lVar32].alphaB;
                        QDataBuffer<QPointF>::reserve(&pQVar9->m_points,(pQVar9->m_points).siz + 1);
                        qVar20 = pQVar11[lVar32].pos.yp;
                        pQVar1 = (pQVar9->m_points).buffer + (pQVar9->m_points).siz;
                        pQVar1->xp = pQVar11[lVar32].pos.xp;
                        pQVar1->yp = qVar20;
                        lVar29 = (pQVar9->m_points).siz + 1;
                        (pQVar9->m_points).siz = lVar29;
                        iVar25 = (int)lVar29 + -1;
                        pQVar9 = this->m_segments;
                        QDataBuffer<QPathSegments::Intersection>::reserve
                                  (&pQVar9->m_intersections,(pQVar9->m_intersections).siz + 1);
                        lVar29 = (pQVar9->m_intersections).siz;
                        pIVar12 = (pQVar9->m_intersections).buffer;
                        pIVar12[lVar29].t = qVar2;
                        pIVar12[lVar29].vertex = iVar25;
                        pIVar12[lVar29].next = 0;
                        (pQVar9->m_intersections).siz = lVar29 + 1;
                        pSVar10 = (pQVar9->m_segments).buffer;
                        lVar31 = (long)pSVar10[segment].intersection;
                        if (lVar31 < 0) {
                          pSVar10[segment].intersection = (int)(lVar29 + 1) + -1;
                        }
                        else {
                          iVar6 = pIVar12[lVar31].next;
                          pIVar22 = pIVar12 + lVar31;
                          while (iVar6 != 0) {
                            lVar31 = (long)iVar6;
                            iVar6 = pIVar22[iVar6].next;
                            pIVar22 = pIVar22 + lVar31;
                          }
                          pIVar22->next =
                               (int)lVar29 - (int)((ulong)((long)pIVar22 - (long)pIVar12) >> 4);
                        }
                        pQVar9 = this->m_segments;
                        QDataBuffer<QPathSegments::Intersection>::reserve
                                  (&pQVar9->m_intersections,(pQVar9->m_intersections).siz + 1);
                        lVar29 = (pQVar9->m_intersections).siz;
                        pIVar12 = (pQVar9->m_intersections).buffer;
                        pIVar12[lVar29].t = qVar3;
                        pIVar12[lVar29].vertex = iVar25;
                        pIVar12[lVar29].next = 0;
                        (pQVar9->m_intersections).siz = lVar29 + 1;
                        pSVar10 = (pQVar9->m_segments).buffer;
                        lVar31 = (long)pSVar10[iVar5].intersection;
                        if (lVar31 < 0) {
                          pSVar10[iVar5].intersection = (int)(lVar29 + 1) + -1;
                        }
                        else {
                          iVar25 = pIVar12[lVar31].next;
                          pIVar22 = pIVar12 + lVar31;
                          while (iVar25 != 0) {
                            lVar31 = (long)iVar25;
                            iVar25 = pIVar22[iVar25].next;
                            pIVar22 = pIVar22 + lVar31;
                          }
                          pIVar22->next =
                               (int)lVar29 - (int)((ulong)((long)pIVar22 - (long)pIVar12) >> 4);
                        }
                        lVar32 = lVar32 + 1;
                      } while (lVar32 < (this->m_intersections).siz);
                    }
                  }
                }
                else {
                  bVar23 = bVar13 | bVar28 | bVar14 | bVar30;
                  if (bVar23 == 0) {
                    auVar38._0_8_ = (dVar41 - dVar4) * dVar59 + -dVar58 * (dVar47 - dVar16);
                    auVar38._8_8_ = (dVar41 - dVar4) * dVar52 + -dVar56 * (dVar47 - dVar16);
                    auVar44._8_8_ = auVar44._0_8_;
                    auVar39 = divpd(auVar38,auVar44);
                    dVar36 = auVar39._0_8_;
                    dVar37 = auVar39._8_8_;
                    if ((((dVar37 <= 1.0) && (0.0 <= dVar37)) && (0.0 <= dVar36)) && (dVar36 <= 1.0)
                       ) {
                      dVar43 = dVar36 + -1.0;
                      uVar34 = -(ulong)(dVar36 < -dVar36);
                      uVar35 = -(ulong)(dVar43 < -dVar43);
                      auVar54._0_8_ = (ulong)-dVar36 & uVar34;
                      auVar54._8_8_ = (ulong)-dVar43 & uVar35;
                      auVar45._0_8_ = ~uVar34 & (ulong)dVar36;
                      auVar45._8_8_ = ~uVar35 & (ulong)dVar43;
                      uVar34 = -(ulong)(dVar37 < -dVar37);
                      dVar50 = (double)(~uVar34 & (ulong)dVar37 | (ulong)-dVar37 & uVar34);
                      dVar36 = dVar37 + -1.0;
                      uVar34 = -(ulong)(dVar36 < -dVar36);
                      dVar53 = (double)(~uVar34 & (ulong)dVar36 | (ulong)-dVar36 & uVar34);
                      dVar36 = SUB168(auVar45 | auVar54,0);
                      dVar43 = SUB168(auVar45 | auVar54,8);
                      auVar15._8_8_ = -(ulong)(dVar43 <= 1e-12);
                      auVar15._0_8_ = -(ulong)(dVar36 <= 1e-12);
                      iVar25 = movmskpd((int)CONCAT71(uVar27,bVar23),auVar15);
                      if ((1e-12 < dVar50 && 1e-12 < dVar53) || (iVar25 == 0)) {
                        uVar34 = -(ulong)(dVar36 <= 1e-12);
                        uVar35 = -(ulong)(dVar43 <= 1e-12);
                        auVar55._0_8_ = (ulong)dVar17 & uVar35;
                        auVar55._8_8_ = (ulong)dVar18 & uVar35;
                        auVar51._0_8_ = ~uVar35 & (ulong)dVar41;
                        auVar51._8_8_ = ~uVar35 & (ulong)dVar47;
                        uVar26 = (uint)(dVar53 <= 1e-12);
                        auVar40._0_8_ =
                             CONCAT44((int)(uVar26 << 0x1f) >> 0x1f,(int)(uVar26 << 0x1f) >> 0x1f);
                        auVar40._8_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                        auVar40._12_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                        uVar26 = (uint)(dVar50 <= 1e-12 || iVar25 != 0);
                        auVar48._0_8_ =
                             CONCAT44((int)(uVar26 << 0x1f) >> 0x1f,(int)(uVar26 << 0x1f) >> 0x1f);
                        auVar48._8_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                        auVar48._12_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                        auVar46._0_8_ =
                             (~uVar34 & SUB168(auVar51 | auVar55,0) | (ulong)dVar4 & uVar34) &
                             auVar48._0_8_;
                        auVar46._8_8_ =
                             (~uVar34 & SUB168(auVar51 | auVar55,8) | (ulong)dVar16 & uVar34) &
                             auVar48._8_8_;
                        auVar49._0_8_ =
                             ~auVar48._0_8_ &
                             (~auVar40._0_8_ & (ulong)(dVar58 * dVar37 + dVar41) |
                             (ulong)dVar57 & auVar40._0_8_);
                        auVar49._8_8_ =
                             ~auVar48._8_8_ &
                             (~auVar40._8_8_ & (ulong)(dVar59 * dVar37 + dVar47) |
                             (ulong)dVar19 & auVar40._8_8_);
                        local_48 = (QPointF)(auVar49 | auVar46);
                        local_58 = auVar39;
                        QDataBuffer<QIntersection>::add(this_00,(QIntersection *)local_58);
                        lVar32 = (this->m_intersections).siz;
                        goto LAB_003f07d4;
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_003f09e2:
        lVar33 = lVar33 + 1;
      } while (lVar33 < (node->index).interval.last);
    }
  }
  else {
    local_58._0_8_ = nodeBounds->x1;
    local_58._8_8_ = nodeBounds->y1;
    local_48.xp = nodeBounds->x2;
    local_48.yp = nodeBounds->y2;
    dVar4 = node->splitLeft;
    (&local_48.xp)[(uint)axis] = dVar4;
    local_78.x1 = nodeBounds->x1;
    local_78.y1 = nodeBounds->y1;
    local_78.x2 = nodeBounds->x2;
    local_78.y2 = nodeBounds->y2;
    (&local_78.x1)[(uint)axis] = node->splitRight;
    if ((node->lowestLeftIndex < segment) && ((&segmentBounds->x1)[(uint)axis] <= dVar4)) {
      produceIntersections
                (this,(this->m_tree).d.ptr + (node->index).interval.first,segment,segmentBounds,
                 (RectF *)local_58,(uint)(axis == 0));
    }
    if ((node->lowestRightIndex < segment) && (node->splitRight <= (&segmentBounds->x2)[(uint)axis])
       ) {
      produceIntersections
                (this,(this->m_tree).d.ptr + (node->index).interval.last,segment,segmentBounds,
                 &local_78,(uint)(axis == 0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SegmentTree::produceIntersections(const TreeNode &node, int segment, const RectF &segmentBounds, const RectF &nodeBounds, int axis)
{
    if (node.leaf) {
        produceIntersectionsLeaf(node, segment);
        return;
    }

    RectF lbounds = nodeBounds;
    (&lbounds.x2)[axis] = node.splitLeft;

    RectF rbounds = nodeBounds;
    (&rbounds.x1)[axis] = node.splitRight;

    if (segment > node.lowestLeftIndex && (&segmentBounds.x1)[axis] <= node.splitLeft)
        produceIntersections(m_tree.at(node.index.children.left), segment, segmentBounds, lbounds, !axis);

    if (segment > node.lowestRightIndex && (&segmentBounds.x2)[axis] >= node.splitRight)
        produceIntersections(m_tree.at(node.index.children.right), segment, segmentBounds, rbounds, !axis);
}